

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * reduce(string *__return_storage_ptr__,string *str,string *fill,string *whitespace)

{
  ulong uVar1;
  long lVar2;
  
  trim(__return_storage_ptr__,str,whitespace);
  for (uVar1 = std::__cxx11::string::find_first_of
                         ((char *)__return_storage_ptr__,(ulong)(whitespace->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find_first_of
                        ((char *)__return_storage_ptr__,(ulong)(whitespace->_M_dataplus)._M_p,
                         uVar1 + fill->_M_string_length)) {
    lVar2 = std::__cxx11::string::find_first_not_of
                      ((char *)__return_storage_ptr__,(ulong)(whitespace->_M_dataplus)._M_p,uVar1);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,(char *)(lVar2 - uVar1),
               (ulong)(fill->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string reduce(const std::string& str,
                   const std::string& fill,
                   const std::string& whitespace) {
  // trim first
  auto result_local = trim(str, whitespace);

  // replace sub ranges
  auto beginSpace = result_local.find_first_of(whitespace);
  while (beginSpace != std::string::npos) {
    const auto endSpace =
        result_local.find_first_not_of(whitespace, beginSpace);
    const auto range = endSpace - beginSpace;

    result_local.replace(beginSpace, range, fill);

    const auto newStart = beginSpace + fill.length();
    beginSpace = result_local.find_first_of(whitespace, newStart);
  }

  return result_local;
}